

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.hpp
# Opt level: O2

void __thiscall helics::FederateInfo::FederateInfo(FederateInfo *this,FederateInfo *param_1)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  CoreType CVar5;
  int iVar6;
  
  CoreFederateInfo::CoreFederateInfo(&this->super_CoreFederateInfo,&param_1->super_CoreFederateInfo)
  ;
  *(undefined4 *)((long)&this->brokerPort + 3) = *(undefined4 *)((long)&param_1->brokerPort + 3);
  cVar1 = param_1->separator;
  bVar2 = param_1->autobroker;
  bVar3 = param_1->debugging;
  bVar4 = param_1->observer;
  CVar5 = param_1->coreType;
  iVar6 = param_1->brokerPort;
  this->uniqueKey = param_1->uniqueKey;
  this->separator = cVar1;
  this->autobroker = bVar2;
  this->debugging = bVar3;
  this->observer = bVar4;
  this->coreType = CVar5;
  this->brokerPort = iVar6;
  std::__cxx11::string::string((string *)&this->profilerFileName,&param_1->profilerFileName);
  std::__cxx11::string::string((string *)&this->encryptionConfig,&param_1->encryptionConfig);
  std::__cxx11::string::string((string *)&this->defName,&param_1->defName);
  std::__cxx11::string::string((string *)&this->coreName,&param_1->coreName);
  std::__cxx11::string::string((string *)&this->coreInitString,&param_1->coreInitString);
  std::__cxx11::string::string((string *)&this->brokerInitString,&param_1->brokerInitString);
  std::__cxx11::string::string((string *)&this->broker,&param_1->broker);
  std::__cxx11::string::string((string *)&this->key,&param_1->key);
  std::__cxx11::string::string((string *)&this->localport,&param_1->localport);
  std::__cxx11::string::string((string *)&this->configString,&param_1->configString);
  this->fileInUse = param_1->fileInUse;
  return;
}

Assistant:

class HELICS_CXX_EXPORT FederateInfo: public CoreFederateInfo {
  public:
    int uniqueKey{0};  //!< location for keying the info for application purposes
    char separator{'/'};  //!< separator for global name of localFederates
    bool autobroker{
        false};  //!< specify that the core should generate a broker if not found otherwise
    /** specify that the core/federate should operate in a user debugging
    mode which will turn off some timeouts*/
    bool debugging{false};
    bool observer{false};
    CoreType coreType{CoreType::DEFAULT};  //!< the type of the core
    int brokerPort{-1};  //!< broker port information

    bool forceNewCore{false};  //!< indicator that the federate should not use an existing core
    /** indicate that the federate should use json serialization for all data transfers*/
    bool useJsonSerialization{false};
    /** specify that the core should use encryption*/
    bool encrypted{false};
    /** specify that the federate and associated core should enable profiling to the specified
     * file*/
    std::string profilerFileName;
    std::string encryptionConfig;  //!< encryption configuration string or file
    std::string defName;  //!< a default name to use for a federate
    std::string coreName;  //!< the name of the core
    std::string coreInitString;  //!< an initialization string for the core API object
    std::string brokerInitString;  //!< an initialization string for the broker if auto generated
    std::string broker;  //!< connection information for the broker
    std::string key;  //!< key for the broker
    std::string localport;  //!< string for defining the local port to use usually a number but
                            //!< other strings are possible

    std::string configString;  //!< storage for config file name or string
    bool fileInUse{false};
    /** default constructor*/
    FederateInfo();
    /** construct from a type
    @param cType the type of core to use for the federate*/
    explicit FederateInfo(CoreType cType);
    /** load a federateInfo object from command line arguments in a string
    @details calls /ref loadInfoFromArgs in the constructor
    @param args a string containing the command line arguments
    */
    explicit FederateInfo(const std::string& args);
    /** load a federateInfo object from command line arguments
    @details calls /ref loadInfoFromArgs in the constructor
    @param argc the number of arguments
    @param argv an array of char * pointers to the arguments
    */
    FederateInfo(int argc, char* argv[]);
    /** load a federateInfo object from arguments stored in a vector
    @details calls /ref loadInfoFromArgs in the constructor
    @param[in,out] args a vector of arguments to load.  The unused arguments will be returned in the
    vector
    */
    explicit FederateInfo(std::vector<std::string>& args);
    /** load a federateInfo object from command line arguments outside the constructor
   @param args a string containing the command line arguments
   @return a vector of strings containing the unused arguments
   */
    std::vector<std::string> loadInfoFromArgs(const std::string& args);
    /** load a federateInfo object from command line arguments outside the constructor
    @param argc the number of arguments
    @param argv an array of char * pointers to the arguments
    @return a vector of strings containing the unused arguments
    */
    std::vector<std::string> loadInfoFromArgs(int argc, char* argv[]);
    /** load a federateInfo object from command line arguments contained in a vector
    @param[in,out] args a vector of arguments to load.  The unused arguments will be returned in the
    vector
    */
    void loadInfoFromArgs(std::vector<std::string>& args);
    /** load a federateInfo object from command line arguments outside the constructor
 @param args a string containing the command line arguments
 */
    void loadInfoFromArgsIgnoreOutput(const std::string& args);
    /** load a federateInfo object from command line arguments outside the constructor
    @param argc the number of arguments
    @param argv an array of char * pointers to the arguments
    */
    void loadInfoFromArgsIgnoreOutput(int argc, char* argv[]);

    /** load a federateInfo object from a toml string either a file or toml string
    @param toml a string containing the name of the toml file or toml contents
    */
    void loadInfoFromToml(const std::string& toml, bool runArgParser = true);

    /** load a federateInfo object from a JSON string either a file or JSON string
  @param json a string containing the name of the JSON file or JSON contents
  */
    void loadInfoFromJson(const std::string& json, bool runArgParser = true);

    /** check if a property has been set and return its value*/
    Time checkTimeProperty(int propId, Time defVal) const;
    bool checkFlagProperty(int propId, bool defVal) const;
    int checkIntProperty(int propId, int defVal) const;

    /** inject the federateInfo parser into another CLI11 App*/
    void injectParser(CLI::App* app);

  private:
    std::unique_ptr<helicsCLI11App> makeCLIApp();
    /** do some additional configuration from config files */
    void config_additional(CLI::App* app);
    /** method for loading info from json*/
    void loadJsonConfig(const fileops::JsonBuffer& json);
}